

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_sparse.cpp
# Opt level: O1

void __thiscall
test_matrix_sparse_operator_assignment_Test::~test_matrix_sparse_operator_assignment_Test
          (test_matrix_sparse_operator_assignment_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(test_matrix_sparse, operator_assignment) {
  Matrix_Sparse matrix_0({0, 2, 5, 5, 7}, {1, 3, 2, 0, 3, 4, 3}, {1.0, 2.0, 3.0, 4.0, 5.0, 6.0, 7.0}, 5);
  Matrix_Sparse matrix_1;
  matrix_1 = matrix_0;

  EXPECT_EQ(matrix_0.size_non_zero(), matrix_1.size_non_zero());
  EXPECT_EQ(matrix_0.size(), matrix_1.size());
  FOR(i_row, matrix_0.size_row())
  FOR(i_column, matrix_0.size_column()) {
    EXPECT_DOUBLE_EQ(matrix_0[i_row][i_column], matrix_1[i_row][i_column]);
  }
}